

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O1

void __thiscall
tcu::x11::egl::DisplayFactory::DisplayFactory(DisplayFactory *this,EventState *eventState)

{
  WindowFactory *this_00;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"x11","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Native X11 Display","");
  eglu::NativeDisplayFactory::NativeDisplayFactory
            (&this->super_NativeDisplayFactory,&local_40,&local_60,
             CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY,0x31d6,
             "EGL_EXT_platform_x11");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_NativeDisplayFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_00d4eae0;
  this->m_eventState = eventState;
  this_00 = (WindowFactory *)operator_new(0x50);
  WindowFactory::WindowFactory(this_00);
  GenericFactoryRegistry::registerFactory
            (&(this->super_NativeDisplayFactory).m_nativeWindowRegistry.m_registry,
             (AbstractFactory *)this_00);
  return;
}

Assistant:

DisplayFactory::DisplayFactory (EventState& eventState)
	: NativeDisplayFactory	("x11", "Native X11 Display",
							 Display::CAPABILITIES,
							 EGL_PLATFORM_X11_SCREEN_EXT,
							 "EGL_EXT_platform_x11")
	, m_eventState			(eventState)
{
	m_nativeWindowRegistry.registerFactory(new WindowFactory());
	// m_nativePixmapRegistry.registerFactory(new PixmapFactory());
}